

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::SubroutineFunctionSet::SubroutineFunctionSet
          (SubroutineFunctionSet *this,SubroutineFunctionSet *param_1)

{
  SubroutineFunctionSet *param_1_local;
  SubroutineFunctionSet *this_local;
  
  std::
  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::vector(&this->fn,&param_1->fn);
  std::__cxx11::string::string((string *)&this->typeName,(string *)&param_1->typeName);
  return;
}

Assistant:

SubroutineFunctionSet(UniformValueGenerator& generator, size_t count = 0) : fn(count, SubroutineFunction(generator))
	{
	}